

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key-unicode.c
# Opt level: O2

uint32_t wpe_unicode_to_key_code(uint32_t wc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (0x5f < wc - 0xa0 && 0x5e < wc - 0x20) {
    iVar2 = 0x2f3;
    iVar3 = 0;
    while (iVar3 <= iVar2) {
      iVar1 = (iVar2 + iVar3) / 2;
      if (unicode_to_keysym_table[iVar1].ucs < wc) {
        iVar3 = iVar1 + 1;
      }
      else {
        if (unicode_to_keysym_table[iVar1].ucs <= wc) {
          return (uint)unicode_to_keysym_table[iVar1].keysym;
        }
        iVar2 = iVar1 + -1;
      }
    }
    wc = wc | 0x1000000;
  }
  return wc;
}

Assistant:

uint32_t
wpe_unicode_to_key_code (uint32_t wc)
{
    int min = 0;
    int max = sizeof(unicode_to_keysym_table) / sizeof(unicode_to_keysym_table[0]) - 1;
    int mid;

    /* First check for Latin-1 characters (1:1 mapping) */
    if ((wc >= 0x0020 && wc <= 0x007e) || (wc >= 0x00a0 && wc <= 0x00ff))
        return wc;

    /* Binary search in table */
    while (max >= min) {
        mid = (min + max) / 2;
        if (unicode_to_keysym_table[mid].ucs < wc)
            min = mid + 1;
        else if (unicode_to_keysym_table[mid].ucs > wc)
            max = mid - 1;
        else /* found it */
            return unicode_to_keysym_table[mid].keysym;
    }

    /*
     * No matching keysym value found, return Unicode value plus 0x01000000
     * (a convention introduced in the UTF-8 work on xterm).
     */
    return wc | 0x01000000;
}